

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O0

void __thiscall
embree::ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
::sort(ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
       *this,size_t blockSize)

{
  int iVar1;
  ulong in_RSI;
  _func_bool_KeyValue_ptr_KeyValue_ptr *in_RDI;
  size_t numThreads;
  size_t in_stack_ffffffffffffff78;
  ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
  *local_78;
  KeyValue *in_stack_ffffffffffffff98;
  KeyValue *in_stack_ffffffffffffffa0;
  ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
  *local_58;
  ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
  *local_50;
  undefined1 *local_38;
  undefined1 *local_30;
  ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
  **local_28;
  ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
  *local_20;
  ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
  *local_18;
  ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
  *local_10;
  ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
  *local_8;
  
  if (in_RSI < *(ulong *)(in_RDI + 0x18)) {
    local_58 = (ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
                *)(((*(long *)(in_RDI + 0x18) + in_RSI) - 1) / in_RSI);
    iVar1 = tbb::detail::d1::max_concurrency();
    local_10 = (ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
                *)(long)iVar1;
    local_28 = &local_58;
    local_30 = &stack0xffffffffffffffa0;
    local_38 = &stack0xffffffffffffff98;
    local_8 = local_58;
    local_78 = local_10;
    if (local_58 < local_10) {
      local_78 = local_8;
    }
    local_20 = (ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
                *)0x40;
    local_18 = local_78;
    local_50 = local_20;
    if (local_78 <
        (ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
         *)0x40) {
      local_50 = local_78;
    }
    tbbRadixSort(local_50,in_stack_ffffffffffffff78);
  }
  else {
    std::
    sort<embree::parallel_map<unsigned_int,unsigned_int>::KeyValue*,bool(*)(embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const&,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const&)>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_RDI);
  }
  return;
}

Assistant:

void sort(const size_t blockSize)
    {
      assert(blockSize > 0);
      
      /* perform single threaded sort for small N */
      if (N<=blockSize) // handles also special case of 0!
      {	  
        /* do inplace sort inside destination array */
        std::sort(src,src+N,compare<Ty>);
      }
      
      /* perform parallel sort for large N */
      else 
      {
        const size_t numThreads = min((N+blockSize-1)/blockSize,TaskScheduler::threadCount(),size_t(MAX_TASKS));
        tbbRadixSort(numThreads);
      }
    }